

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryReader::readHeader(WasmBinaryReader *this)

{
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  uint32_t local_14;
  WasmBinaryReader *pWStack_10;
  uint32_t version;
  WasmBinaryReader *this_local;
  
  pWStack_10 = this;
  verifyInt32(this,0x6d736100);
  local_14 = getInt32(this);
  if (local_14 == 1) {
    return;
  }
  if (local_14 == 0x1000d) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "this looks like a wasm component, which Binaryen does not support yet (see https://github.com/WebAssembly/binaryen/issues/6728)"
               ,&local_39);
    throwError(this,&local_38);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"invalid version",&local_71);
  throwError(this,&local_70);
}

Assistant:

void WasmBinaryReader::readHeader() {
  verifyInt32(BinaryConsts::Magic);
  auto version = getInt32();
  if (version != BinaryConsts::Version) {
    if (version == 0x1000d) {
      throwError("this looks like a wasm component, which Binaryen does not "
                 "support yet (see "
                 "https://github.com/WebAssembly/binaryen/issues/6728)");
    }
    throwError("invalid version");
  }
}